

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void keyboardHandleModifiers
               (void *userData,wl_keyboard *keyboard,uint32_t serial,uint32_t modsDepressed,
               uint32_t modsLatched,uint32_t modsLocked,uint32_t group)

{
  int iVar1;
  size_t i;
  long lVar2;
  anon_struct_8_2_14e37ca0 modifiers [6];
  xkb_mod_index_t local_48;
  uint local_44;
  xkb_mod_index_t local_40;
  undefined4 local_3c;
  xkb_mod_index_t local_38;
  undefined4 local_34;
  xkb_mod_index_t local_30;
  undefined4 local_2c;
  xkb_mod_index_t local_28;
  undefined4 local_24;
  xkb_mod_index_t local_20;
  undefined4 local_1c;
  
  _glfw.wl.serial = serial;
  if (_glfw.wl.xkb.keymap != (xkb_keymap *)0x0) {
    lVar2 = 0;
    (*_glfw.wl.xkb.state_update_mask)
              (_glfw.wl.xkb.state,modsDepressed,modsLatched,modsLocked,0,0,group);
    _glfw.wl.xkb.modifiers = 0;
    local_48 = _glfw.wl.xkb.controlIndex;
    local_44 = 2;
    local_40 = _glfw.wl.xkb.altIndex;
    local_3c = 4;
    local_38 = _glfw.wl.xkb.shiftIndex;
    local_34 = 1;
    local_30 = _glfw.wl.xkb.superIndex;
    local_2c = 8;
    local_28 = _glfw.wl.xkb.capsLockIndex;
    local_24 = 0x10;
    local_20 = _glfw.wl.xkb.numLockIndex;
    local_1c = 0x20;
    do {
      iVar1 = (*_glfw.wl.xkb.state_mod_index_is_active)
                        (_glfw.wl.xkb.state,(&local_48)[lVar2 * 2],XKB_STATE_MODS_EFFECTIVE);
      if (iVar1 == 1) {
        _glfw.wl.xkb.modifiers = _glfw.wl.xkb.modifiers | (&local_44)[lVar2 * 2];
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
  }
  return;
}

Assistant:

static void keyboardHandleModifiers(void* userData,
                                    struct wl_keyboard* keyboard,
                                    uint32_t serial,
                                    uint32_t modsDepressed,
                                    uint32_t modsLatched,
                                    uint32_t modsLocked,
                                    uint32_t group)
{
    _glfw.wl.serial = serial;

    if (!_glfw.wl.xkb.keymap)
        return;

    xkb_state_update_mask(_glfw.wl.xkb.state,
                          modsDepressed,
                          modsLatched,
                          modsLocked,
                          0,
                          0,
                          group);

    _glfw.wl.xkb.modifiers = 0;

    struct
    {
        xkb_mod_index_t index;
        unsigned int bit;
    } modifiers[] =
    {
        { _glfw.wl.xkb.controlIndex,  GLFW_MOD_CONTROL },
        { _glfw.wl.xkb.altIndex,      GLFW_MOD_ALT },
        { _glfw.wl.xkb.shiftIndex,    GLFW_MOD_SHIFT },
        { _glfw.wl.xkb.superIndex,    GLFW_MOD_SUPER },
        { _glfw.wl.xkb.capsLockIndex, GLFW_MOD_CAPS_LOCK },
        { _glfw.wl.xkb.numLockIndex,  GLFW_MOD_NUM_LOCK }
    };

    for (size_t i = 0; i < sizeof(modifiers) / sizeof(modifiers[0]); i++)
    {
        if (xkb_state_mod_index_is_active(_glfw.wl.xkb.state,
                                          modifiers[i].index,
                                          XKB_STATE_MODS_EFFECTIVE) == 1)
        {
            _glfw.wl.xkb.modifiers |= modifiers[i].bit;
        }
    }
}